

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O3

int lmder(custom_funcmult *funcmult,custom_jacobian *jacobian,double *x,int M,int N,double *fvec,
         double *fjac,int ldfjac,int maxfev,double *diag,int mode,double factor,int nprint,
         double eps,double ftol,double gtol,double xtol,int *nfev,int *njev,int *ipvt,double *qtf)

{
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  double dVar5;
  double *rdiag;
  double *acnorm;
  double *x_00;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  double *pdVar9;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  int iVar13;
  undefined4 in_register_00000084;
  ulong uVar14;
  double *pdVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double *in_stack_fffffffffffffe48;
  double local_88;
  double local_78;
  double par;
  double *local_68;
  int local_5c;
  double *local_58;
  int local_4c;
  double local_48;
  ulong local_40;
  ulong local_38;
  
  local_40 = CONCAT44(in_register_00000084,N);
  local_38 = (ulong)N;
  sVar1 = local_38 * 8;
  local_58 = x;
  rdiag = (double *)malloc(sVar1);
  acnorm = (double *)malloc(sVar1);
  x_00 = (double *)malloc(sVar1);
  lVar6 = (long)M;
  local_68 = (double *)malloc(lVar6 * 8);
  uVar16 = 0;
  *nfev = 0;
  *njev = 0;
  uVar17 = 0;
  if ((((((0 < (int)local_38) && (uVar17 = uVar16, (int)local_40 <= M)) && (M <= ldfjac)) &&
       ((0.0 <= ftol && (0.0 <= xtol)))) && (0.0 < factor)) && ((0 < maxfev && (0.0 <= gtol)))) {
    local_38 = local_40 & 0xffffffff;
    if (mode == 2) {
      uVar7 = 0;
      do {
        if (diag[uVar7] <= 0.0) {
          return 0;
        }
        uVar7 = uVar7 + 1;
      } while (local_38 != uVar7);
    }
    (*funcmult->funcmult)(local_58,M,(int)local_40,fvec,funcmult->params);
    *nfev = 1;
    local_88 = enorm(fvec,M);
    uVar7 = local_38;
    local_78 = 0.0;
    iVar4 = (int)local_40;
    sVar1 = (ulong)(uint)M * 8;
    local_5c = 1;
    local_4c = M;
    while( true ) {
      pdVar11 = local_68;
      pdVar9 = fjac;
      (*jacobian->jacobian)(local_58,local_4c,(int)local_40,fjac,jacobian->params);
      *njev = *njev + 1;
      qrfac(fjac,local_4c,(int)local_40,(int)pdVar9,1,ipvt,(int)in_stack_fffffffffffffe48,rdiag,
            acnorm,eps);
      if (local_5c == 1) {
        if (mode != 2) {
          uVar8 = 0;
          do {
            uVar19 = -(ulong)(acnorm[uVar8] == 0.0);
            diag[uVar8] = (double)(uVar19 & 0x3ff0000000000000 | ~uVar19 & (ulong)acnorm[uVar8]);
            uVar8 = uVar8 + 1;
          } while (local_38 != uVar8);
        }
        uVar8 = 0;
        do {
          x_00[uVar8] = diag[uVar8] * local_58[uVar8];
          uVar8 = uVar8 + 1;
        } while (local_38 != uVar8);
        par = enorm(x_00,(int)local_40);
        local_48 = par * factor;
        if ((local_48 == 0.0) && (!NAN(local_48))) {
          local_48 = factor;
        }
      }
      memcpy(pdVar11,fvec,sVar1);
      uVar19 = 0;
      uVar8 = (ulong)(uint)M;
      pdVar9 = pdVar11;
      pdVar12 = fjac;
      do {
        iVar13 = (iVar4 + 1) * (int)uVar19;
        dVar26 = fjac[iVar13];
        if (((dVar26 != 0.0) || (NAN(dVar26))) && ((long)uVar19 < lVar6)) {
          dVar20 = 0.0;
          uVar14 = 0;
          pdVar15 = pdVar12;
          do {
            dVar20 = dVar20 + *pdVar15 * pdVar9[uVar14];
            pdVar15 = pdVar15 + uVar7;
            uVar14 = uVar14 + 1;
          } while (uVar8 != uVar14);
          if ((long)uVar19 < lVar6) {
            uVar14 = 0;
            pdVar15 = pdVar12;
            do {
              pdVar9[uVar14] = *pdVar15 * (-dVar20 / dVar26) + pdVar9[uVar14];
              pdVar15 = pdVar15 + uVar7;
              uVar14 = uVar14 + 1;
            } while (uVar8 != uVar14);
          }
        }
        fjac[iVar13] = rdiag[uVar19];
        qtf[uVar19] = pdVar11[uVar19];
        uVar19 = uVar19 + 1;
        pdVar12 = pdVar12 + uVar7 + 1;
        pdVar9 = pdVar9 + 1;
        uVar8 = uVar8 - 1;
      } while (uVar19 != local_38);
      dVar26 = 0.0;
      if ((local_88 != 0.0) || (NAN(local_88))) {
        lVar18 = 1;
        uVar14 = 0;
        pdVar11 = fjac;
        uVar8 = local_38;
        do {
          dVar20 = acnorm[ipvt[uVar14]];
          if ((dVar20 != 0.0) || (NAN(dVar20))) {
            dVar23 = 0.0;
            lVar10 = 0;
            pdVar9 = pdVar11;
            do {
              dVar23 = dVar23 + (qtf[lVar10] / local_88) * *pdVar9;
              lVar10 = lVar10 + 1;
              pdVar9 = pdVar9 + uVar7;
            } while (lVar18 != lVar10);
            dVar26 = pmax(dVar26,ABS(dVar23 / dVar20));
            uVar8 = local_38;
          }
          uVar14 = uVar14 + 1;
          lVar18 = lVar18 + 1;
          pdVar11 = pdVar11 + 1;
        } while (uVar14 != uVar8);
      }
      if (dVar26 <= gtol) break;
      if (mode != 2) {
        uVar8 = 0;
        do {
          dVar20 = pmax(diag[uVar8],acnorm[uVar8]);
          diag[uVar8] = dVar20;
          uVar8 = uVar8 + 1;
        } while (local_38 != uVar8);
      }
      dVar27 = 0.0;
      dVar20 = local_48;
      dVar23 = par;
      while (par = dVar23, local_48 = dVar20, dVar27 < 0.0001) {
        in_stack_fffffffffffffe48 = &local_78;
        lmpar(fjac,(int)uVar19,(int)local_40,ipvt,diag,qtf,dVar20,in_stack_fffffffffffffe48,rdiag,
              acnorm);
        uVar8 = 0;
        do {
          dVar20 = rdiag[uVar8];
          dVar23 = -dVar20;
          rdiag[uVar8] = dVar23;
          acnorm[uVar8] = local_58[uVar8] - dVar20;
          x_00[uVar8] = diag[uVar8] * dVar23;
          uVar8 = uVar8 + 1;
        } while (local_38 != uVar8);
        dVar23 = enorm(x_00,(int)local_40);
        if (local_5c == 1) {
          local_48 = pmin(local_48,dVar23);
        }
        pdVar11 = local_68;
        (*funcmult->funcmult)(acnorm,local_4c,(int)local_40,local_68,funcmult->params);
        *nfev = *nfev + 1;
        dVar21 = enorm(pdVar11,local_4c);
        dVar25 = 1.0 - (dVar21 / local_88) * (dVar21 / local_88);
        uVar14 = -(ulong)(dVar21 * 0.1 < local_88);
        dVar20 = (double)(~uVar14 & 0xbff0000000000000 | uVar14 & (ulong)dVar25);
        lVar18 = 1;
        uVar8 = 0;
        pdVar11 = fjac;
        do {
          x_00[uVar8] = 0.0;
          dVar24 = rdiag[ipvt[uVar8]];
          lVar10 = 0;
          pdVar9 = pdVar11;
          do {
            x_00[lVar10] = *pdVar9 * dVar24 + x_00[lVar10];
            lVar10 = lVar10 + 1;
            pdVar9 = pdVar9 + uVar7;
          } while (lVar18 != lVar10);
          uVar8 = uVar8 + 1;
          lVar18 = lVar18 + 1;
          pdVar11 = pdVar11 + 1;
        } while (uVar8 != local_38);
        dVar27 = enorm(x_00,(int)local_40);
        dVar5 = local_78;
        if (local_78 < 0.0) {
          dVar22 = sqrt(local_78);
        }
        else {
          dVar22 = SQRT(local_78);
        }
        dVar22 = (dVar22 * dVar23) / local_88;
        dVar22 = dVar22 * dVar22;
        dVar29 = (dVar27 / local_88) * (dVar27 / local_88);
        dVar28 = dVar22 + dVar22 + dVar29;
        dVar27 = (double)(-(ulong)(dVar28 != 0.0) & (ulong)(dVar20 / dVar28));
        if (dVar27 <= 0.25) {
          dVar29 = dVar29 + dVar22;
          dVar20 = (double)(~-(ulong)(dVar20 < 0.0) &
                            (~-(ulong)(dVar20 < 0.0) & 0x3fe0000000000000 |
                            (ulong)dVar24 & -(ulong)(dVar20 < 0.0)) |
                           (ulong)((dVar29 * -0.5) / (dVar20 * 0.5 - dVar29)) &
                           -(ulong)(dVar20 < 0.0));
          dVar24 = 0.1;
          if (dVar21 * 0.1 < local_88 && 0.1 <= dVar20) {
            dVar24 = dVar20;
          }
          dVar20 = pmin(local_48,dVar23 / 0.1);
          dVar20 = dVar20 * dVar24;
          local_78 = dVar5 / dVar24;
        }
        else if (((dVar5 == 0.0) && (!NAN(dVar5))) || (dVar20 = local_48, 0.75 <= dVar27)) {
          dVar20 = dVar23 + dVar23;
          local_78 = dVar5 * 0.5;
        }
        uVar19 = local_38;
        dVar23 = par;
        if (0.0001 <= dVar27) {
          uVar8 = 0;
          do {
            dVar23 = acnorm[uVar8];
            local_58[uVar8] = dVar23;
            acnorm[uVar8] = dVar23 * diag[uVar8];
            uVar8 = uVar8 + 1;
          } while (local_38 != uVar8);
          local_48 = dVar20;
          memcpy(fvec,local_68,sVar1);
          uVar19 = local_40;
          dVar23 = enorm(acnorm,(int)local_40);
          local_5c = local_5c + 1;
          dVar20 = local_48;
          local_88 = dVar21;
        }
        dVar21 = (double)(~uVar14 & 0x3ff0000000000000 | (ulong)ABS(dVar25) & uVar14);
        bVar2 = ftol < dVar21;
        bVar3 = ftol < dVar28;
        dVar25 = dVar27 * 0.5;
        dVar24 = dVar23 * xtol;
        if (((!bVar3 && !bVar2) && (dVar25 <= 1.0)) && (dVar20 <= dVar24)) {
          uVar17 = 3;
          goto LAB_00145f42;
        }
        if (((!bVar3 && !bVar2) && 1.0 >= dVar25) || (dVar20 <= dVar24)) {
          uVar17 = 2;
          if (dVar24 < dVar20) {
            uVar17 = (byte)~((bVar3 || bVar2) || 1.0 < dVar25) & 1;
          }
          goto LAB_00145f42;
        }
        uVar16 = (uint)(maxfev <= *nfev) * 5;
        uVar17 = 6;
        if (1.0 < dVar25) {
          uVar17 = uVar16;
        }
        if (eps < dVar28) {
          uVar17 = uVar16;
        }
        if (eps < dVar21) {
          uVar17 = uVar16;
        }
        if (dVar20 <= dVar23 * eps) {
          uVar17 = 7;
        }
        if (dVar26 <= eps) {
          uVar17 = 8;
        }
        if (uVar17 != 0) goto LAB_00145f42;
      }
    }
    uVar17 = 4;
LAB_00145f42:
    free(rdiag);
    free(acnorm);
    free(x_00);
    free(local_68);
  }
  return uVar17;
}

Assistant:

int lmder(custom_funcmult *funcmult, custom_jacobian *jacobian, double *x, int M, int N,
		double *fvec,double *fjac,int ldfjac,int maxfev,double *diag,int mode,double factor,int nprint,
		double eps,double ftol,double gtol,double xtol,int *nfev,int *njev,int *ipvt, double *qtf) {
	int info;
	int i,j,l,iter;
    double actred,delta,dirder,epsmch,fnorm,fnorm1,gnorm,one,par,pnorm,prered,p1,p5,p25,p75,p0001,ratio,
    sum,temp,temp1,temp2,xnorm,zero;
    double *wa1,*wa2,*wa3,*wa4;

    /*
     * 	*   This routine is a C translation of Fortran Code by
    *     argonne national laboratory. minpack project. march 1980.
     	  burton s. garbow, kenneth e. hillstrom, jorge j. more
     *  M is a positive integer input variable set to the number
c         of functions.
c
c       N is a positive integer input variable set to the number
c         of variables. N must not exceed M.
c
c       x is an array of length N. on input x must contain
c         an initial estimate of the solution vector. on output x
c         contains the final estimate of the solution vector.
c
c       fvec is an output array of length M which contains
c         the functions evaluated at the output x.
c
c       fjac is an output M by N array. the upper N by N submatrix
c         of fjac contains an upper triangular matrix r with
c         diagonal elements of nonincreasing magnitude such that
c
c                t     t           t
c               p *(jac *jac)*p = r *r,
c
c         where p is a permutation matrix and jac is the final
c         calculated jacobian. column j of p is column ipvt(j)
c         (see below) of the identity matrix. the lower trapezoidal
c         part of fjac contains information generated during
c         the computation of r.
c
c       ldfjac is a positive integer input variable not less than M
c         which specifies the leading dimension of the array fjac.
c
c       ftol is a nonnegative input variable. termination
c         occurs when both the actual and predicted relative
c         reductions in the sum of squares are at most ftol.
c         therefore, ftol measures the relative error desired
c         in the sum of squares.
c
c       xtol is a nonnegative input variable. termination
c         occurs when the relative error between two consecutive
c         iterates is at most xtol. therefore, xtol measures the
c         relative error desired in the approximate solution.
c
c       gtol is a nonnegative input variable. termination
c         occurs when the cosine of the angle between fvec and
c         any column of the jacobian is at most gtol in absolute
c         value. therefore, gtol measures the orthogonality
c         desired between the function vector and the columns
c         of the jacobian.
c
c       maxfev is a positive integer input variable. termination
c         occurs when the number of calls to fcn with iflag = 1
c         has reached maxfev.
c
c       diag is an array of length N. if mode = 1 (see
c         below), diag is internally set. if mode = 2, diag
c         must contain positive entries that serve as
c         multiplicative scale factors for the variables.
c
c       mode is an integer input variable. if mode = 1, the
c         variables will be scaled internally. if mode = 2,
c         the scaling is specified by the input diag. other
c         values of mode are equivalent to mode = 1.
c
c       factor is a positive input variable used in determining the
c         initial step bound. this bound is set to the product of
c         factor and the euclidean norm of diag*x if nonzero, or else
c         to factor itself. in most cases factor should lie in the
c         interval (.1,100.).100. is a generally recommended value.
c
c       nprint is an integer input variable that enables controlled
c         printing of iterates if it is positive. in this case,
c         fcn is called with iflag = 0 at the beginning of the first
c         iteration and every nprint iterations thereafter and
c         immediately prior to return, with x, fvec, and fjac
c         available for printing. fvec and fjac should not be
c         altered. if nprint is not positive, no special calls
c         of fcn with iflag = 0 are made.
c
c       info is an integer output variable. if the user has
c         terminated execution, info is set to the (negative)
c         value of iflag. see description of fcn. otherwise,
c         info is set as follows.
c
c         info = 0  improper input parameters.
c
c         info = 1  both actual and predicted relative reductions
c                   in the sum of squares are at most ftol.
c
c         info = 2  relative error between two consecutive iterates
c                   is at most xtol.
c
c         info = 3  conditions for info = 1 and info = 2 both hold.
c
c         info = 4  the cosine of the angle between fvec and any
c                   column of the jacobian is at most gtol in
c                   absolute value.
c
c         info = 5  number of calls to fcn with iflag = 1 has
c                   reached maxfev.
c
c         info = 6  ftol is too small. no further reduction in
c                   the sum of squares is possible.
c
c         info = 7  xtol is too small. no further improvement in
c                   the approximate solution x is possible.
c
c         info = 8  gtol is too small. fvec is orthogonal to the
c                   columns of the jacobian to machine precision.
c
c       nfev is an integer output variable set to the number of
c         calls to fcn with iflag = 1.
c
c       njev is an integer output variable set to the number of
c         calls to fcn with iflag = 2.
c
c       ipvt is an integer output array of length N. ipvt
c         defines a permutation matrix p such that jac*p = q*r,
c         where jac is the final calculated jacobian, q is
c         orthogonal (not stored), and r is upper triangular
c         with diagonal elements of nonincreasing magnitude.
c         column j of p is column ipvt(j) of the identity matrix.
c
c       qtf is an output array of length N which contains
c         the first n elements of the vector (q transpose)*fvec.
     */

	wa1 = (double*) malloc(sizeof(double) *N);
	wa2 = (double*) malloc(sizeof(double) *N);
	wa3 = (double*) malloc(sizeof(double) *N);
	wa4 = (double*) malloc(sizeof(double) *M);

    one = 1.0;
    zero = 0.0;
    p1 = 1.0e-1; p5 = 5.0e-1; p25 = 2.5e-1; p75 = 7.5e-1; p0001 = 1.0e-4;
    epsmch = eps;

    info = 0;
    *nfev = 0;
    *njev = 0;

    if (N <= 0 || M < N || ldfjac < M || ftol < zero || xtol < zero || gtol < zero || maxfev <= 0 || factor <= zero) {
    	return info;
    }
    if (mode == 2) {
		for(j = 0; j < N;++j) {
			if (diag[j] <= 0.0) {
				return info;
			}
		}
    }

    //     evaluate the function at the starting point
    //     and calculate its norm.

    FUNCMULT_EVAL(funcmult,x,M,N,fvec);
    *nfev= 1;
    fnorm = enorm(fvec,M);

    //     initialize levenberg-marquardt parameter and iteration counter.
    par = zero;
    iter = 1;
    ratio = zero;

    //     beginning of the outer loop.

    while(1) {
    	//        calculate the jacobian matrix.
    	ratio = zero;
    	JACOBIAN_EVAL(jacobian,x,M,N,fjac);
    	*njev = *njev +1;

    	//        compute the qr factorization of the jacobian.

    	qrfac(fjac,M,N,ldfjac,1,ipvt,N,wa1,wa2,eps);

    	//        on the first iteration and if mode is 1, scale according
    	//        to the norms of the columns of the initial jacobian.

    	if (iter == 1) {//80
    		if (mode != 2) {//60
    			for(j = 0;j < N;++j) {
    				diag[j] = wa2[j];
    				if (wa2[j] == zero) {
    					diag[j] = one;
    				}
    			}
    		}//60

    		//        on the first iteration, calculate the norm of the scaled x
    		//        and initialize the step bound delta.

    		for(j = 0; j < N;++j) {
    			wa3[j] = diag[j]*x[j];
    		}
            xnorm = enorm(wa3,N);
            delta = factor*xnorm;

            if (delta == zero) {
            	delta = factor;
            }

    	}//80

        //        form (q transpose)*fvec and store the first n components in
        //        qtf.

    	for(i = 0; i < M;++i) {
    		wa4[i] = fvec[i];
    	}

    	for(j = 0; j < N;++j) {//130
    		if (fjac[j*N+j] != zero) {//120
    			sum = zero;
    			for(i = j; i < M;++i) {//100
    				sum = sum + fjac[i*N+j]*wa4[i];
    			}//100
    			temp = -sum/fjac[j*N+j];
    			for(i = j; i < M;++i) {//110
    				wa4[i] = wa4[i] + fjac[i*N+j]*temp;
    			}//110
    		}//120
            fjac[j*N+j] = wa1[j];
            qtf[j] = wa4[j];
    	}//130

    	//        compute the norm of the scaled gradient.
    	gnorm = zero;

    	if (fnorm != zero) {//170
    		for(j = 0; j < N;++j) {//160
    			l = ipvt[j];
    			if (wa2[l] != zero) {//150
    				sum = zero;
    				for(i = 0; i <= j;++i) { //140
    					sum = sum + fjac[i*N+j]*(qtf[i]/fnorm);
    				}//140
    				gnorm = pmax(gnorm,fabs(sum/wa2[l]));
    			}//150
    		}//160
    	}//170

    	//        test for convergence of the gradient norm.
    	if (gnorm <= gtol) {
    		info = 4;
    	}
    	if (info != 0) {
    		break;
    	}

    	//        rescale if necessary.
    	if (mode != 2) { //190
    		for(j = 0; j < N;++j) {
    			diag[j] = pmax(diag[j],wa2[j]);
    		}
    	}//190

    	//        beginning of the inner loop.

    	while(ratio < p0001) {
    		//           determine the levenberg-marquardt parameter.
    		lmpar(fjac,ldfjac,N,ipvt,diag,qtf,delta,&par,wa1,wa2);
    		//           store the direction p and x + p. calculate the norm of p.
    		for(j = 0; j < N;++j) {
                wa1[j] = -wa1[j];
                wa2[j] = x[j] + wa1[j];
                wa3[j] = diag[j]*wa1[j];
    		}
    		pnorm = enorm(wa3,N);
    		//           on the first iteration, adjust the initial step bound.
    		if (iter == 1) {
    			delta = pmin(delta,pnorm);
    		}
    		//           evaluate the function at x + p and calculate its norm.

    		FUNCMULT_EVAL(funcmult,wa2,M,N,wa4);
    		*nfev = *nfev + 1;
    		fnorm1 = enorm(wa4,M);

    		//           compute the scaled actual reduction.

            actred = -one;
            if (p1*fnorm1 < fnorm) {
            	actred = one - (fnorm1/fnorm)*(fnorm1/fnorm);
            }

            //           compute the scaled predicted reduction and
            //           the scaled directional derivative.

            for(j = 0; j < N;++j) {
                wa3[j] = zero;
                l = ipvt[j];
                temp = wa1[l];
                for(i = 0;i <= j;++i) {
                	wa3[i] = wa3[i] + fjac[i*N+j]*temp;
                }
            }

            temp1 = enorm(wa3,N);
            temp1 = temp1/fnorm;
            temp2 = (sqrt(par)*pnorm)/fnorm;
            prered = temp1*temp1 + temp2*temp2/p5;
            dirder = -(temp1*temp1 + temp2*temp2);
            //           compute the ratio of the actual to the predicted
            //           reduction.
            ratio = zero;
            if (prered != zero) {
            	ratio = actred/prered;
            }
            //           update the step bound.

            if (ratio <= p25) {//240
            	if (actred >= zero) {
            		temp = p5;
            	}
            	if (actred < zero) {
            		temp = p5*dirder/(dirder + p5*actred);
            	}
            	if (p1*fnorm1 >= fnorm || temp < p1) {
            		temp = p1;
            	}
                delta = temp*pmin(delta,pnorm/p1);
                par = par/temp;
            } else if (par == zero || ratio >= p75){//240 - 260
                delta = pnorm/p5;
                par = p5*par;
            }//260

            //           test for successful iteration.

            if (ratio >= p0001) {//290
            	//           successful iteration. update x, fvec, and their norms.
            	for(j = 0; j < N;++j) {
                    x[j] = wa2[j];
                    wa2[j] = diag[j]*x[j];
            	}
            	for(i = 0; i < M;++i) {
            		fvec[i] = wa4[i];
            	}
                xnorm = enorm(wa2,N);
                fnorm = fnorm1;
                iter = iter + 1;
            }//290
            //           tests for convergence.
            if ((fabs(actred) <= ftol) && (prered <= ftol) && (p5*ratio <= one)) {
            	info = 1;
            }
            if (delta <= xtol*xnorm) {
            	info = 2;
            }
            if ((fabs(actred) <= ftol) && (prered <= ftol) && (p5*ratio <= one) && (info == 2)) {
            	info = 3;
            }
            if (info != 0) {
            	break;
            }

            //           tests for termination and stringent tolerances.
            if (*nfev >= maxfev) {
            	info = 5;
            }
            if ((fabs(actred) <= epsmch) && (prered <= epsmch) && (p5*ratio <= one)) {
            	info = 6;
            }
            if (delta <= epsmch*xnorm) {
            	info = 7;
            }
            if (gnorm <= epsmch) {
            	info = 8;
            }
            if (info != 0) {
            	break;
            }

    	}

        if (info != 0) {
        	break;
        }


    }


    free(wa1);
    free(wa2);
    free(wa3);
    free(wa4);

	return info;
}